

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.h
# Opt level: O3

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxDevexPR(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  int32_t iVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxPricer = (_func_int **)&PTR_getName_003b26d0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_name = "Devex";
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.fpclass = cpp_dec_float_finite;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.prec_elem = 10;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
  pnVar4 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance;
  (pnVar4->m_backend).data._M_elems[0] = 0;
  (pnVar4->m_backend).data._M_elems[1] = 0;
  pcVar6 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend;
  (pcVar6->data)._M_elems[2] = 0;
  (pcVar6->data)._M_elems[3] = 0;
  pcVar6 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend;
  (pcVar6->data)._M_elems[4] = 0;
  (pcVar6->data)._M_elems[5] = 0;
  pcVar6 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend;
  (pcVar6->data)._M_elems[6] = 0;
  (pcVar6->data)._M_elems[7] = 0;
  pcVar6 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend;
  (pcVar6->data)._M_elems[8] = 0;
  (pcVar6->data)._M_elems[9] = 0;
  *(undefined8 *)
   ((long)(this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems + 0x25) = 0;
  pcVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
  uVar1 = *(undefined8 *)((pcVar6->data)._M_elems + 2);
  uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 4);
  uVar3 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
  *(undefined8 *)
   (this->
   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thetolerance.m_backend.data._M_elems = *(undefined8 *)(pcVar6->data)._M_elems;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 8) = *(undefined8 *)((pcVar6->data)._M_elems + 8);
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.exp = pcVar6->exp;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.neg = pcVar6->neg;
  iVar5 = pcVar6->prec_elem;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.fpclass = pcVar6->fpclass;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.prec_elem = iVar5;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = (IdxElement *)0x0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxPricer = (_func_int **)&PTR_getName_003b2798;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&(this->last).m_backend,0,(type *)0x0);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array(&this->prices,0);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array(&this->pricesCo,0);
  DIdxSet::DIdxSet(&this->bestPrices,8);
  DIdxSet::DIdxSet(&this->bestPricesCo,8);
  this->refined = false;
  return;
}

Assistant:

SPxDevexPR()
      : SPxPricer<R>("Devex")
      , last(0)
      , refined(false)
   {}